

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int make_canonical(ly_ctx *ctx,int type,char **value,void *data1,void *data2)

{
  byte bVar1;
  uint uVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  char *__string;
  uint8_t *puVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  long lVar12;
  char cVar13;
  ulong uVar14;
  char *local_40;
  
  __string = ly_buf();
  puVar6 = ly_buf_used_location();
  if ((*puVar6 == '\0') || (*__string == '\0')) {
    local_40 = (char *)0x0;
  }
  else {
    local_40 = strndup(__string,0x3ff);
  }
  puVar6 = ly_buf_used_location();
  *puVar6 = *puVar6 + '\x01';
  switch(type) {
  case 2:
    uVar2 = *data2;
    *__string = '\0';
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
      puVar3 = *(undefined8 **)((long)data1 + uVar14 * 8);
      if (puVar3 != (undefined8 *)0x0) {
        if (*__string == '\0') {
          strcpy(__string,(char *)*puVar3);
        }
        else {
          pcVar11 = strdup(__string);
          sprintf(__string,"%s %s",pcVar11,*puVar3);
          free(pcVar11);
        }
      }
    }
    break;
  default:
    goto switchD_0012360f_caseD_3;
  case 4:
    lVar8 = *data1;
    if (lVar8 == 0) {
      builtin_strncpy(__string,"0.0",4);
    }
    else {
      bVar1 = *data2;
      iVar5 = sprintf(__string,"%ld ",lVar8);
      if (iVar5 + -1 <= (int)(uint)bVar1) {
        iVar5 = sprintf(__string,"0%0*ld ",(ulong)(uint)bVar1,lVar8);
      }
      lVar8 = (long)iVar5;
      lVar9 = lVar8 << 0x20;
      iVar5 = -(uint)bVar1;
      bVar4 = true;
      for (lVar12 = 0; iVar5 != (int)lVar12; lVar12 = lVar12 + -1) {
        if (iVar5 + 1 == (int)lVar12 || !bVar4) {
          cVar13 = __string[lVar12 + lVar8 + -2];
LAB_001237d5:
          __string[lVar12 + lVar8 + -1] = cVar13;
          bVar4 = false;
        }
        else {
          cVar13 = __string[lVar12 + lVar8 + -2];
          if (cVar13 != '0') goto LAB_001237d5;
          __string[lVar12 + lVar8 + -1] = '\0';
          bVar4 = true;
        }
        lVar9 = lVar9 + -0x100000000;
      }
      __string[(lVar9 >> 0x20) + -1] = '.';
    }
    break;
  case 7:
    pcVar11 = *value;
    pcVar7 = strchr(pcVar11,0x3a);
    if (pcVar7 == (char *)0x0) {
      sprintf(__string,"%s:%s",data1,pcVar11);
    }
    else {
      strcpy(__string,pcVar11);
    }
    break;
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x12:
    uVar10 = *data1;
    pcVar11 = "%ld";
    goto LAB_0012362f;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    uVar10 = *data1;
    pcVar11 = "%lu";
LAB_0012362f:
    sprintf(__string,pcVar11,uVar10);
  }
  pcVar11 = *value;
  iVar5 = strcmp(__string,pcVar11);
  if (iVar5 != 0) {
    lydict_remove(ctx,pcVar11);
    pcVar11 = lydict_insert(ctx,__string,0);
    *value = pcVar11;
  }
switchD_0012360f_caseD_3:
  if (local_40 != (char *)0x0) {
    strcpy(__string,local_40);
    free(local_40);
  }
  puVar6 = ly_buf_used_location();
  *puVar6 = *puVar6 + 0xff;
  return (int)puVar6;
}

Assistant:

static int
make_canonical(struct ly_ctx *ctx, int type, const char **value, void *data1, void *data2)
{
    char *buf = ly_buf(), *buf_backup = NULL, *str;
    struct lys_type_bit **bits = NULL;
    const char *module_name;
    int i, j, count, ret = 0;
    int64_t num;
    uint64_t unum;
    uint8_t c;

    /* prepare buffer for creating canonical representation */
    if (ly_buf_used && buf[0]) {
        buf_backup = strndup(buf, LY_BUF_SIZE - 1);
    }
    ly_buf_used++;

    switch (type) {
    case LY_TYPE_BITS:
        bits = (struct lys_type_bit **)data1;
        count = *((int *)data2);
        /* in canonical form, the bits are ordered by their position */
        buf[0] = '\0';
        for (i = 0; i < count; i++) {
            if (!bits[i]) {
                /* bit not set */
                continue;
            }
            if (buf[0]) {
                str = strdup(buf);
                sprintf(buf, "%s %s", str, bits[i]->name);
                free(str);
            } else {
                sprintf(buf, "%s", bits[i]->name);
            }
        }
        break;

    case LY_TYPE_IDENT:
        module_name = (const char *)data1;
        /* identity must always have a prefix */
        if (!strchr(*value, ':')) {
            sprintf(buf, "%s:%s", module_name, *value);
        } else {
            strcpy(buf, *value);
        }
        break;

    case LY_TYPE_DEC64:
        num = *((int64_t *)data1);
        c = *((uint8_t *)data2);
        if (num) {
            count = sprintf(buf, "%"PRId64" ", num);
            if ((count - 1) <= c) {
                /* we have 0. value, print the value with the leading zeros
                 * (one for 0. and also keep the correct with of num according
                 * to fraction-digits value) */
                count = sprintf(buf, "0%0*"PRId64" ", c, num);
            }
            for (i = c, j = 1; i > 0 ; i--) {
                if (j && i > 1 && buf[count - 2] == '0') {
                    /* we have trailing zero to skip */
                    buf[count - 1] = '\0';
                } else {
                    j = 0;
                    buf[count - 1] = buf[count - 2];
                }
                count--;
            }
            buf[count - 1] = '.';
        } else {
            /* zero */
            sprintf(buf, "0.0");
        }
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
        num = *((int64_t *)data1);
        sprintf(buf, "%"PRId64, num);
        break;

    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        unum = *((uint64_t *)data1);
        sprintf(buf, "%"PRIu64, unum);
        break;

    default:
        /* should not be even called - just do nothing */
        goto cleanup;
    }

    if (strcmp(buf, *value)) {
        lydict_remove(ctx, *value);
        *value = lydict_insert(ctx, buf, 0);
        ret = 1;
    }

cleanup:
    if (buf_backup) {
        /* return previous internal buffer content */
        strcpy(buf, buf_backup);
        free(buf_backup);
    }
    ly_buf_used--;

    return ret;
}